

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointCloudGM.cpp
# Opt level: O1

string * __thiscall
csm::PointCloudGM::getFamily_abi_cxx11_(string *__return_storage_ptr__,PointCloudGM *this)

{
  size_type *psVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  string local_38;
  
  GeometricModel::getFamily_abi_cxx11_(&local_38,&this->super_GeometricModel);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PointCloud","");
  uVar3 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    uVar3 = local_38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar3 < local_50 + local_38._M_string_length) {
    uVar4 = 0xf;
    if (local_58 != local_48) {
      uVar4 = local_48[0];
    }
    if (local_50 + local_38._M_string_length <= uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_58,0,(char *)0x0,(ulong)local_38._M_dataplus._M_p);
      goto LAB_0011b7cc;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
LAB_0011b7cc:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar3 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PointCloudGM::getFamily() const
{
   return GeometricModel::getFamily() + std::string(CSM_POINTCLOUD_FAMILY);
}